

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O1

int32_t parse_sort_bfr(Btor2Parser *bfr,Btor2Line *l)

{
  int64_t iVar1;
  int iVar2;
  int32_t iVar3;
  char *pcVar4;
  Btor2Sort tmp;
  Btor2Sort s;
  undefined4 local_70;
  undefined4 uStack_6c;
  char *local_68;
  int64_t iStack_60;
  int64_t local_58;
  Btor2Sort local_50;
  
  pcVar4 = parse_tag(bfr);
  if (pcVar4 == (char *)0x0) {
    return 0;
  }
  iVar2 = strcmp(pcVar4,"bitvec");
  if (iVar2 == 0) {
    local_70 = 1;
    local_68 = "bitvec";
    iVar3 = parse_pos_number_bfr(bfr,(uint32_t *)&iStack_60);
    if (iVar3 == 0) {
      return 0;
    }
    if ((uint32_t)iStack_60 != 0) {
LAB_00103aa0:
      iVar1 = l->id;
      (l->sort).field_3.array.element = local_58;
      (l->sort).name = local_68;
      (l->sort).field_3.array.index = iStack_60;
      (l->sort).id = iVar1;
      *(ulong *)&(l->sort).tag = CONCAT44(uStack_6c,local_70);
      return 1;
    }
    pcVar4 = "bit width must be greater than 0";
  }
  else {
    iVar2 = strcmp(pcVar4,"array");
    if (iVar2 == 0) {
      local_70 = 0;
      local_68 = "array";
      local_50.id = 0;
      iVar3 = parse_sort_id_bfr(bfr,&local_50);
      if (iVar3 == 0) {
        return 0;
      }
      iVar3 = getc_bfr(bfr);
      if (iVar3 == 0x20) {
        iStack_60 = local_50.id;
        iVar3 = parse_sort_id_bfr(bfr,&local_50);
        if (iVar3 == 0) {
          return 0;
        }
        local_58 = local_50.id;
        goto LAB_00103aa0;
      }
      pcVar4 = "expected space";
    }
    else {
      pcVar4 = "invalid sort tag";
    }
  }
  perr_bfr(bfr,pcVar4);
  return 0;
}

Assistant:

static int32_t
parse_sort_bfr (Btor2Parser *bfr, Btor2Line *l)
{
  const char *tag;
  Btor2Sort tmp, s;
  tag = parse_tag (bfr);
  if (!tag) return 0;
  if (!strcmp (tag, "bitvec"))
  {
    tmp.tag  = BTOR2_TAG_SORT_bitvec;
    tmp.name = "bitvec";
    if (!parse_pos_number_bfr (bfr, &tmp.bitvec.width)) return 0;
    if (tmp.bitvec.width == 0)
      return perr_bfr (bfr, "bit width must be greater than 0");
  }
  else if (!strcmp (tag, "array"))
  {
    tmp.tag  = BTOR2_TAG_SORT_array;
    tmp.name = "array";
    s.id = 0;   /* get rid of false positive compiler warning */
    if (!parse_sort_id_bfr (bfr, &s)) return 0;
    if (getc_bfr (bfr) != ' ') return perr_bfr (bfr, "expected space");
    tmp.array.index = s.id;
    if (!parse_sort_id_bfr (bfr, &s)) return 0;
    tmp.array.element = s.id;
  }
  else
  {
    return perr_bfr (bfr, "invalid sort tag");
  }
  tmp.id  = l->id;
  l->sort = tmp;
  return 1;
}